

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmemory.c
# Opt level: O1

int dQuerySpace(SuperMatrix *L,SuperMatrix *U,mem_usage_t *mem_usage)

{
  void *pvVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  long lVar5;
  float fVar6;
  
  iVar4 = sp_ienv(1);
  pvVar1 = U->Store;
  lVar5 = (long)L->ncol;
  fVar3 = (float)L->ncol;
  fVar2 = (float)iVar4;
  fVar6 = (float)(*(int *)(*(long *)((long)L->Store + 0x20) + lVar5 * 4) << 2) +
          (fVar3 * 4.0 + 3.0) * 4.0 +
          (float)(*(int *)(*(long *)((long)L->Store + 0x10) + lVar5 * 4) << 3);
  mem_usage->for_lu = fVar6;
  fVar6 = (fVar3 + 1.0) * 4.0 + (float)(*(int *)(*(long *)((long)pvVar1 + 0x18) + lVar5 * 4) * 0xc)
          + fVar6;
  mem_usage->for_lu = fVar6;
  mem_usage->total_needed =
       (fVar2 + fVar2 + 4.0 + 3.0) * fVar3 * 4.0 + (fVar2 + 1.0) * fVar3 * 8.0 + fVar6;
  return 0;
}

Assistant:

int dQuerySpace(SuperMatrix *L, SuperMatrix *U, mem_usage_t *mem_usage)
{
    SCformat *Lstore;
    NCformat *Ustore;
    register int n, iword, dword, panel_size = sp_ienv(1);

    Lstore = L->Store;
    Ustore = U->Store;
    n = L->ncol;
    iword = sizeof(int);
    dword = sizeof(double);

    /* For LU factors */
    mem_usage->for_lu = (float)( (4.0*n + 3.0) * iword +
                                 Lstore->nzval_colptr[n] * dword +
                                 Lstore->rowind_colptr[n] * iword );
    mem_usage->for_lu += (float)( (n + 1.0) * iword +
				 Ustore->colptr[n] * (dword + iword) );

    /* Working storage to support factorization */
    mem_usage->total_needed = mem_usage->for_lu +
	(float)( (2.0 * panel_size + 4.0 + NO_MARKER) * n * iword +
		(panel_size + 1.0) * n * dword );

    return 0;
}